

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgstrf.c
# Opt level: O3

void sgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  uint n;
  int iVar1;
  int *et;
  fact_t fVar2;
  int iVar3;
  int_t iVar4;
  int_t iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int_t *piVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int_t *piVar16;
  int nseg;
  ulong local_170;
  int *local_168;
  int *repfnz;
  int *segrep;
  fact_t local_150;
  int nseg1;
  int_t *local_148;
  int_t *xprune;
  superlu_options_t *local_138;
  int *local_130;
  float *dense;
  int *marker;
  uint local_118;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_100;
  int_t *local_f8;
  ulong local_f0;
  ulong local_e8;
  int_t *local_e0;
  float *tempv;
  int_t *xplore;
  int_t *local_c8;
  int_t *local_c0;
  int *local_b8;
  int *local_b0;
  SuperMatrix *local_a8;
  ulong local_a0;
  int *local_98;
  int_t *local_90;
  int_t *local_88;
  double local_80;
  int *panel_lsub;
  int *parent;
  float *swork;
  int *iwork;
  int_t *local_58;
  long local_50;
  flops_t *local_48;
  long local_40;
  long local_38;
  
  local_170 = CONCAT44(local_170._4_4_,relax);
  local_168 = etree;
  iVar3 = sp_ienv(6);
  local_150 = options->Fact;
  local_80 = options->DiagPivotThresh;
  local_98 = stat->panel_histo;
  local_48 = stat->ops;
  uVar6 = A->nrow;
  local_100 = (ulong)uVar6;
  n = A->ncol;
  local_a0 = (ulong)n;
  local_118 = n;
  if ((int)uVar6 < (int)n) {
    local_118 = uVar6;
  }
  piVar16 = (int_t *)A->Store;
  local_38 = *(long *)(piVar16 + 2);
  local_148 = *(int_t **)(piVar16 + 4);
  local_88 = *(int_t **)(piVar16 + 6);
  local_90 = *(int_t **)(piVar16 + 8);
  local_f0 = (ulong)(uint)panel_size;
  local_a8 = A;
  iVar4 = sLUMemInit(local_150,work,lwork,uVar6,n,*piVar16,panel_size,(float)iVar3,L,U,Glu,&iwork,
                     &swork);
  uVar11 = local_a0;
  uVar14 = local_100;
  *info = iVar4;
  if (iVar4 != 0) {
    return;
  }
  iVar3 = (int)local_170;
  local_b0 = Glu->xsup;
  local_b8 = Glu->supno;
  local_c0 = Glu->xlsub;
  local_c8 = Glu->xlusup;
  local_e0 = Glu->xusub;
  iVar7 = (int)local_a0;
  iVar8 = (int)local_f0;
  iVar12 = (int)local_100;
  local_138 = options;
  SetIWork(iVar12,iVar7,iVar8,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
  sSetRWork(iVar12,iVar8,swork,&dense,&tempv);
  usepr = (int)(local_150 == SamePattern_SameRowPerm);
  if (local_150 == SamePattern_SameRowPerm) {
    local_130 = int32Malloc(iVar12);
    if (0 < iVar12) {
      uVar13 = 0;
      do {
        local_130[perm_r[uVar13]] = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
  }
  else {
    local_130 = (int *)0x0;
  }
  piVar16 = local_148;
  et = local_168;
  local_168 = int32Malloc(iVar7);
  if (0 < iVar7) {
    uVar13 = 0;
    do {
      local_168[perm_c[uVar13]] = (int)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  piVar9 = intMalloc(iVar7);
  if (local_138->SymmetricMode == YES) {
    heap_relax_snode(iVar7,et,iVar3,marker,piVar9);
  }
  else {
    relax_snode(iVar7,et,iVar3,marker,piVar9);
  }
  ifill(perm_r,iVar12,-1);
  ifill(marker,iVar12 * 3,-1);
  *local_b8 = -1;
  uVar13 = 0;
  *local_c8 = 0;
  *local_e0 = 0;
  *local_c0 = 0;
  *local_b0 = 0;
  local_f8 = piVar9;
  if ((int)local_118 < 1) {
    *info = 0;
  }
  else {
    local_58 = piVar9 + 1;
    local_50 = (long)iVar12 << 2;
    iVar3 = 0;
    do {
      iVar7 = (int)uVar13;
      lVar15 = (long)iVar7;
      iVar12 = local_f8[lVar15];
      if (iVar12 == -1) {
        local_170 = uVar13 & 0xffffffff;
        uVar6 = (int)local_f0 + iVar7;
        if ((int)local_118 <= (int)uVar6) {
          uVar6 = local_118;
        }
        uVar14 = 0;
        do {
          if ((long)(int)uVar6 <= (long)(lVar15 + 1 + uVar14)) {
            uVar6 = iVar7 + (int)uVar14 + 1;
            uVar11 = local_f0;
            goto LAB_00105c06;
          }
          uVar11 = uVar14 + 1;
          lVar10 = lVar15 + uVar14;
          uVar14 = uVar11;
        } while (local_58[lVar10] == -1);
        uVar6 = iVar7 + (int)uVar11;
LAB_00105c06:
        iVar12 = local_118 - iVar7;
        if (uVar6 != local_118) {
          iVar12 = (int)uVar11;
        }
        local_98[iVar12] = local_98[iVar12] + 1;
        iVar8 = (int)local_100;
        spanel_dfs(iVar8,iVar12,iVar7,local_a8,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,xprune,
                   marker,parent,xplore,Glu);
        spanel_bmod(iVar8,iVar12,iVar7,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar13 = (ulong)(uint)(iVar7 + iVar12);
        piVar16 = local_148;
        if (0 < iVar12) {
          local_138 = (superlu_options_t *)(long)(iVar7 + iVar12);
          lVar10 = 0;
          local_e8 = uVar13;
          do {
            nseg = nseg1;
            iVar7 = (int)lVar15;
            iVar12 = scolumn_dfs((int)local_100,iVar7,perm_r,&nseg,
                                 (int *)((long)panel_lsub + lVar10),segrep,
                                 (int *)((long)repfnz + lVar10),xprune,marker,parent,xplore,Glu);
            *info = iVar12;
            if (iVar12 != 0) {
              return;
            }
            iVar12 = scolumn_bmod(iVar7,nseg - nseg1,(float *)((long)dense + lVar10),tempv,
                                  segrep + nseg1,(int *)((long)repfnz + lVar10),(int)local_170,Glu,
                                  stat);
            *info = iVar12;
            if (iVar12 != 0) {
              return;
            }
            iVar12 = scopy_to_ucol(iVar7,nseg,segrep,(int *)((long)repfnz + lVar10),perm_r,
                                   (float *)((long)dense + lVar10),Glu);
            *info = iVar12;
            if (iVar12 != 0) {
              return;
            }
            iVar8 = spivotL(iVar7,local_80,&usepr,perm_r,local_130,local_168,&pivrow,Glu,stat);
            *info = iVar8;
            iVar12 = iVar3;
            if (iVar3 == 0) {
              iVar12 = iVar8;
            }
            if (iVar8 != 0) {
              iVar3 = iVar12;
            }
            spruneL(iVar7,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar10),xprune,Glu);
            resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar10));
            lVar15 = lVar15 + 1;
            lVar10 = lVar10 + local_50;
            uVar13 = local_e8;
            piVar16 = local_148;
          } while (lVar15 < (long)local_138);
        }
      }
      else {
        local_98[(long)(iVar12 - iVar7) + 1] = local_98[(long)(iVar12 - iVar7) + 1] + 1;
        local_170 = CONCAT44(local_170._4_4_,iVar12);
        iVar4 = ssnode_dfs(iVar7,iVar12,piVar16,local_88,local_90,xprune,marker,Glu);
        *info = iVar4;
        if (iVar4 != 0) {
          return;
        }
        local_138 = (superlu_options_t *)CONCAT44(local_138._4_4_,local_e0[lVar15]);
        iVar4 = local_c8[lVar15];
        local_e8 = (ulong)local_b8[lVar15];
        local_40 = (long)local_b0[local_e8];
        iVar8 = local_c0[local_40 + 1];
        iVar1 = local_c0[local_40];
        nzlumax = Glu->nzlumax;
        while (piVar16 = local_148, nzlumax < (iVar8 - iVar1) * ((iVar12 - iVar7) + 1) + iVar4) {
          iVar5 = sLUMemXpand(iVar7,iVar4,LUSUP,&nzlumax,Glu);
          *info = iVar5;
          if (iVar5 != 0) {
            return;
          }
        }
        if (iVar7 <= (int)local_170) {
          local_170 = CONCAT44(local_170._4_4_,(int)local_170 + 1);
          do {
            local_e0[lVar15 + 1] = (int_t)local_138;
            lVar10 = (long)local_88[lVar15];
            iVar12 = local_90[lVar15];
            if (local_88[lVar15] < iVar12) {
              do {
                dense[piVar16[lVar10]] = *(float *)(local_38 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (iVar12 != lVar10);
            }
            lVar10 = lVar15 + 1;
            ssnode_bmod((int)lVar15,(int)local_e8,(int)local_40,dense,tempv,Glu,stat);
            iVar7 = spivotL((int)lVar15,local_80,&usepr,perm_r,local_130,local_168,&pivrow,Glu,stat)
            ;
            *info = iVar7;
            iVar12 = iVar3;
            if (iVar3 == 0) {
              iVar12 = iVar7;
            }
            if (iVar7 != 0) {
              iVar3 = iVar12;
            }
            lVar15 = lVar10;
          } while ((int)local_170 != (int)lVar10);
          uVar13 = local_170 & 0xffffffff;
        }
      }
    } while ((int)uVar13 < (int)local_118);
    *info = iVar3;
    iVar7 = iVar3 + -1;
    iVar12 = (int)local_a0;
    uVar14 = local_100;
    uVar11 = local_a0;
    if (iVar3 != 0) goto LAB_00105f1b;
  }
  iVar7 = (int)uVar11;
  iVar12 = iVar7;
LAB_00105f1b:
  uVar6 = local_118;
  fVar2 = local_150;
  iVar3 = (int)uVar14;
  if (0 < iVar3 && iVar7 < iVar3) {
    uVar11 = 1;
    do {
      if (perm_r[uVar11 - 1] == -1) {
        perm_r[uVar11 - 1] = iVar7;
        iVar7 = iVar7 + 1;
      }
    } while ((uVar11 < uVar14) && (uVar11 = uVar11 + 1, iVar7 < iVar3));
  }
  countnz(local_118,xprune,&nnzL,&nnzU,Glu);
  fixupL(uVar6,perm_r,Glu);
  sLUWorkFree(iwork,swork,Glu);
  superlu_free(xplore);
  superlu_free(xprune);
  if (fVar2 == SamePattern_SameRowPerm) {
    piVar16 = (int_t *)L->Store;
    *piVar16 = nnzL;
    piVar16[1] = Glu->supno[iVar12];
    piVar9 = Glu->xlusup;
    *(void **)(piVar16 + 2) = Glu->lusup;
    *(int_t **)(piVar16 + 4) = piVar9;
    piVar9 = Glu->xlsub;
    *(int_t **)(piVar16 + 6) = Glu->lsub;
    *(int_t **)(piVar16 + 8) = piVar9;
    piVar16 = (int_t *)U->Store;
    *piVar16 = nnzU;
    piVar9 = Glu->usub;
    *(void **)(piVar16 + 2) = Glu->ucol;
    *(int_t **)(piVar16 + 4) = piVar9;
    *(int_t **)(piVar16 + 6) = Glu->xusub;
  }
  else {
    sCreate_SuperNode_Matrix
              (L,local_a8->nrow,uVar6,nnzL,(float *)Glu->lusup,Glu->xlusup,Glu->lsub,Glu->xlsub,
               Glu->supno,Glu->xsup,SLU_SC,SLU_S,SLU_TRLU);
    sCreate_CompCol_Matrix
              (U,uVar6,uVar6,nnzU,(float *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_S,SLU_TRU);
  }
  piVar16 = local_f8;
  local_48[7] = local_48[0x13] + local_48[0x14] + local_48[7];
  iVar3 = Glu->num_expansions + -1;
  Glu->num_expansions = iVar3;
  stat->expansions = iVar3;
  if (fVar2 == SamePattern_SameRowPerm) {
    superlu_free(local_130);
  }
  superlu_free(local_168);
  superlu_free(piVar16);
  return;
}

Assistant:

void
sgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    float    *swork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    float    *dense, *tempv;
    int       *relax_end;
    float    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    float fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = sLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &swork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    sSetRWork(m, panel_size, swork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = ssnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = sLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        ssnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = spivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		sprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    spanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    spanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = scolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = scolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = scopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = spivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	spruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		sprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    sLUWorkFree(iwork, swork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (float *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (float *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        sCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (float *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_S, SLU_TRLU);
    	sCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (float *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_S, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}